

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int sintf1_(int *n,int *inc,double *x,double *wsave,double *xh,double *work,int *ier)

{
  double dVar1;
  int iVar2;
  long in_RCX;
  int iVar3;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  undefined8 *in_R8;
  double dVar4;
  double *r__;
  double dVar5;
  undefined4 *in_stack_00000008;
  double ssqrt3;
  double xhold;
  double sfnp1;
  int lnsv;
  int lnwk;
  int lnxh;
  double dsum;
  int modn;
  int ier1;
  int ns2;
  int np1;
  int kc;
  double t2;
  double t1;
  int k;
  int i__;
  int i__1;
  int x_offset;
  int x_dim1;
  undefined4 in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  int iVar6;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  double local_58;
  double local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  undefined8 *local_28;
  long local_20;
  long local_18;
  int *local_8;
  
  local_34 = *in_RSI;
  local_38 = local_34 + 1;
  local_18 = in_RDX + (long)local_38 * -8;
  local_20 = in_RCX + -8;
  local_28 = in_R8 + -1;
  *in_stack_00000008 = 0;
  local_3c = *in_RDI + -2;
  if (-1 < local_3c) {
    if (local_3c == 0) {
      dVar4 = sqrt(3.0);
      dVar5 = *(double *)(local_18 + (long)(local_34 + 1) * 8);
      dVar1 = *(double *)(local_18 + (long)(local_34 * 2 + 1) * 8);
      *(double *)(local_18 + (long)(local_34 * 2 + 1) * 8) =
           (1.0 / dVar4) *
           (*(double *)(local_18 + (long)(local_34 + 1) * 8) -
           *(double *)(local_18 + (long)(local_34 * 2 + 1) * 8));
      *(double *)(local_18 + (long)(local_34 + 1) * 8) = (1.0 / dVar4) * (dVar5 + dVar1);
    }
    else {
      iVar2 = *in_RDI + 1;
      local_64 = *in_RDI / 2;
      for (local_44 = 1; local_44 <= local_64; local_44 = local_44 + 1) {
        local_5c = iVar2 - local_44;
        local_50 = *(double *)(local_18 + (long)(local_44 * local_34 + 1) * 8) -
                   *(double *)(local_18 + (long)(local_5c * local_34 + 1) * 8);
        local_58 = *(double *)(local_20 + (long)local_44 * 8) *
                   (*(double *)(local_18 + (long)(local_44 * local_34 + 1) * 8) +
                   *(double *)(local_18 + (long)(local_5c * local_34 + 1) * 8));
        local_28[local_44 + 1] = local_50 + local_58;
        local_28[local_5c + 1] = local_58 - local_50;
      }
      iVar3 = *in_RDI % 2;
      if (iVar3 != 0) {
        local_28[local_64 + 2] =
             *(double *)(local_18 + (long)((local_64 + 1) * local_34 + 1) * 8) * 4.0;
      }
      *in_R8 = 0;
      iVar6 = iVar2;
      local_60 = iVar2;
      local_3c = local_64;
      local_8 = in_RDI;
      r__ = (double *)log((double)iVar2);
      log(2.0);
      rfft1f_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,r__,
              (int *)CONCAT44(iVar2,in_stack_ffffffffffffff50),(double *)&local_68,
              (int *)&stack0xffffffffffffff80,(double *)CONCAT44(iVar6,local_60),
              in_stack_ffffffffffffff88,(int *)CONCAT44(iVar3,in_stack_ffffffffffffff90));
      if (local_68 == 0) {
        if (local_60 % 2 == 0) {
          local_28[local_60] = (double)local_28[local_60] + (double)local_28[local_60];
        }
        *(double *)(local_18 + (long)(local_34 + 1) * 8) = (double)local_28[1] * 0.5;
        dVar5 = *(double *)(local_18 + (long)(local_34 + 1) * 8);
        iVar2 = *local_8;
        for (local_40 = 3; local_40 <= iVar2; local_40 = local_40 + 2) {
          *(double *)(local_18 + (long)((local_40 + -1) * local_34 + 1) * 8) =
               (double)local_28[local_40] * 0.5;
          dVar5 = (double)local_28[local_40 + -1] * 0.5 + dVar5;
          *(double *)(local_18 + (long)(local_40 * local_34 + 1) * 8) = dVar5;
        }
        if (iVar3 == 0) {
          *(double *)(local_18 + (long)(*local_8 * local_34 + 1) * 8) =
               (double)local_28[*local_8 + 1] * 0.5;
        }
      }
      else {
        *in_stack_00000008 = 0x14;
      }
    }
  }
  return 0;
}

Assistant:

int sintf1_(int *n, int *inc, fft_real_t *x, fft_real_t *wsave,
	fft_real_t *xh, fft_real_t *work, int *ier)
{
    /* System generated locals */
    int x_dim1, x_offset, i__1;

    /* Builtin functions */

    /* Local variables */
     int i__, k;
     fft_real_t t1, t2;
     int kc, np1, ns2, ier1, modn;
     fft_real_t dsum;
     int lnxh, lnwk, lnsv;
     fft_real_t sfnp1, xhold;
    extern /* Subroutine */ int rfft1f_(int *, int *, fft_real_t *, int
	    *, fft_real_t *, int *, fft_real_t *, int *, int *);
     fft_real_t ssqrt3;
    extern /* Subroutine */ int xerfft_(char *, int *, ftnlen);

    /* Parameter adjustments */
    x_dim1 = *inc;
    x_offset = 1 + x_dim1;
    x -= x_offset;
    --wsave;
    --xh;

    /* Function Body */
    *ier = 0;
    if ((i__1 = *n - 2) < 0) {
	goto L200;
    } else if (i__1 == 0) {
	goto L102;
    } else {
	goto L103;
    }
L102:
    ssqrt3 = 1.0 / sqrt(3.0);
    xhold = ssqrt3 * (x[x_dim1 + 1] + x[(x_dim1 << 1) + 1]);
    x[(x_dim1 << 1) + 1] = ssqrt3 * (x[x_dim1 + 1] - x[(x_dim1 << 1) + 1]);
    x[x_dim1 + 1] = xhold;
    goto L200;
L103:
    np1 = *n + 1;
    ns2 = *n / 2;
    i__1 = ns2;
    for (k = 1; k <= i__1; ++k) {
	kc = np1 - k;
	t1 = x[k * x_dim1 + 1] - x[kc * x_dim1 + 1];
	t2 = wsave[k] * (x[k * x_dim1 + 1] + x[kc * x_dim1 + 1]);
	xh[k + 1] = t1 + t2;
	xh[kc + 1] = t2 - t1;
/* L104: */
    }
    modn = *n % 2;
    if (modn == 0) {
	goto L124;
    }
    xh[ns2 + 2] = x[(ns2 + 1) * x_dim1 + 1] * 4.0;
L124:
    xh[1] = 0.0;
    lnxh = np1;
    lnsv = np1 + (int) (log((fft_real_t) np1) / log(2.0)) + 4;
    lnwk = np1;

    rfft1f_(&np1, &c__1, &xh[1], &lnxh, &wsave[ns2 + 1], &lnsv, work, &lnwk, &
	    ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("SINTF1", &c_n5, (ftnlen)6);
	goto L200;
    }

    if (np1 % 2 != 0) {
	goto L30;
    }
    xh[np1] += xh[np1];
L30:
    sfnp1 = 1.0 / (fft_real_t) np1;
    x[x_dim1 + 1] = xh[1] * .5;
    dsum = x[x_dim1 + 1];
    i__1 = *n;
    for (i__ = 3; i__ <= i__1; i__ += 2) {
	x[(i__ - 1) * x_dim1 + 1] = xh[i__] * .5;
	dsum += xh[i__ - 1] * .5;
	x[i__ * x_dim1 + 1] = dsum;
/* L105: */
    }
    if (modn != 0) {
	goto L200;
    }
    x[*n * x_dim1 + 1] = xh[*n + 1] * .5;
L200:
    return 0;
}